

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-context.c
# Opt level: O0

void textui_process_click(ui_event e)

{
  loc_conflict grid;
  chunk_conflict *pcVar1;
  player *ppVar2;
  _Bool _Var3;
  wchar_t wVar4;
  wchar_t x_00;
  loc_conflict lVar5;
  loc lVar6;
  object *poVar7;
  command *pcVar8;
  monster *m_00;
  monster *m;
  wchar_t y;
  wchar_t x;
  byte bStack_10;
  byte bStack_f;
  char cStack_e;
  ui_event e_local;
  
  pcVar1 = cave;
  if (((player->opts).opt[0x13] & 1U) != 0) {
    bStack_f = e.key.code._1_1_;
    wVar4 = (int)((uint)bStack_f - row_top_map[Term->sidebar_mode]) / (int)(uint)tile_height +
            Term->offset_y;
    bStack_10 = (byte)e.key.code;
    x_00 = (int)((uint)bStack_10 - col_map[Term->sidebar_mode]) / (int)(uint)tile_width +
           Term->offset_x;
    lVar5 = (loc_conflict)loc(x_00,wVar4);
    _Var3 = square_in_bounds_fully((chunk *)pcVar1,lVar5);
    ppVar2 = player;
    if (_Var3) {
      lVar6 = loc(x_00,wVar4);
      _Var3 = loc_eq(ppVar2->grid,lVar6);
      pcVar1 = cave;
      cStack_e = e.key.code._2_1_;
      if (_Var3) {
        if (((undefined1  [12])e & (undefined1  [12])0x200000000000000) == (undefined1  [12])0x0) {
          if (((undefined1  [12])e & (undefined1  [12])0x100000000000000) == (undefined1  [12])0x0)
          {
            if (((undefined1  [12])e & (undefined1  [12])0x400000000000000) == (undefined1  [12])0x0
               ) {
              if (cStack_e == '\x01') {
                lVar5 = (loc_conflict)loc(x_00,wVar4);
                poVar7 = square_object((chunk *)pcVar1,lVar5);
                if (poVar7 == (object *)0x0) {
                  cmdq_push(CMD_HOLD);
                }
                else {
                  cmdq_push(CMD_PICKUP);
                }
              }
              else if (cStack_e == '\x02') {
                context_menu_player((uint)bStack_10,(uint)bStack_f);
              }
            }
            else if (cStack_e == '\x01') {
              Term_keypress(0x43,'\0');
            }
          }
          else if (cStack_e == '\x01') {
            lVar5.x = (player->grid).x;
            lVar5.y = (player->grid).y;
            _Var3 = square_isupstairs((chunk *)cave,lVar5);
            if (_Var3) {
              cmdq_push(CMD_GO_UP);
            }
            else {
              grid.x = (player->grid).x;
              grid.y = (player->grid).y;
              _Var3 = square_isdownstairs((chunk *)cave,grid);
              if (_Var3) {
                cmdq_push(CMD_GO_DOWN);
              }
            }
          }
          else if (cStack_e == '\x02') {
            cmdq_push(CMD_USE);
          }
        }
        else if (cStack_e == '\x01') {
          cmdq_push(CMD_CAST);
        }
        else if (cStack_e == '\x02') {
          Term_keypress(0x69,'\0');
        }
      }
      else if (cStack_e == '\x01') {
        if (player->timed[4] == 0) {
          if (((undefined1  [12])e & (undefined1  [12])0x200000000000000) == (undefined1  [12])0x0)
          {
            if (((undefined1  [12])e & (undefined1  [12])0x100000000000000) == (undefined1  [12])0x0
               ) {
              if (((undefined1  [12])e & (undefined1  [12])0x400000000000000) ==
                  (undefined1  [12])0x0) {
                if (((wVar4 - (player->grid).y < -1) || (1 < wVar4 - (player->grid).y)) ||
                   ((x_00 - (player->grid).x < -1 || (1 < x_00 - (player->grid).x)))) {
                  cmdq_push(CMD_PATHFIND);
                  pcVar8 = cmdq_peek();
                  lVar5 = (loc_conflict)loc(x_00,wVar4);
                  cmd_set_arg_point(pcVar8,"point",lVar5);
                }
                else {
                  cmdq_push(CMD_WALK);
                  pcVar8 = cmdq_peek();
                  ppVar2 = player;
                  lVar6 = loc(x_00,wVar4);
                  wVar4 = motion_dir(ppVar2->grid,lVar6);
                  cmd_set_arg_direction(pcVar8,"direction",wVar4);
                }
              }
              else {
                _Var3 = target_set_interactive(L'\x02',x_00,wVar4);
                if (_Var3) {
                  msg("Target Selected.");
                }
              }
            }
            else {
              cmdq_push(CMD_ALTER);
              pcVar8 = cmdq_peek();
              ppVar2 = player;
              lVar6 = loc(x_00,wVar4);
              wVar4 = motion_dir(ppVar2->grid,lVar6);
              cmd_set_arg_direction(pcVar8,"direction",wVar4);
            }
          }
          else {
            cmdq_push(CMD_RUN);
            pcVar8 = cmdq_peek();
            ppVar2 = player;
            lVar6 = loc(x_00,wVar4);
            wVar4 = motion_dir(ppVar2->grid,lVar6);
            cmd_set_arg_direction(pcVar8,"direction",wVar4);
          }
        }
        else {
          cmdq_push(CMD_WALK);
        }
      }
      else if (cStack_e == '\x02') {
        lVar5 = (loc_conflict)loc(x_00,wVar4);
        m_00 = square_monster((chunk *)pcVar1,lVar5);
        if ((m_00 == (monster *)0x0) || (_Var3 = target_able(m_00), !_Var3)) {
          target_set_location(wVar4,x_00);
        }
        else {
          monster_race_track(player->upkeep,m_00->race);
          health_track(player->upkeep,m_00);
          target_set_monster(m_00);
        }
        if (((undefined1  [12])e & (undefined1  [12])0x200000000000000) == (undefined1  [12])0x0) {
          if (((undefined1  [12])e & (undefined1  [12])0x100000000000000) == (undefined1  [12])0x0)
          {
            if (((undefined1  [12])e & (undefined1  [12])0x400000000000000) == (undefined1  [12])0x0
               ) {
              if ((((wVar4 - (player->grid).y < -1) || (1 < wVar4 - (player->grid).y)) ||
                  (x_00 - (player->grid).x < -1)) || (1 < x_00 - (player->grid).x)) {
                context_menu_cave((chunk *)cave,wVar4,x_00,L'\0',(uint)bStack_10,(uint)bStack_f);
              }
              else {
                context_menu_cave((chunk *)cave,wVar4,x_00,L'\x01',(uint)bStack_10,(uint)bStack_f);
              }
            }
            else {
              cmdq_push(CMD_THROW);
              pcVar8 = cmdq_peek();
              cmd_set_arg_target(pcVar8,"target",L'\x05');
            }
          }
          else {
            cmdq_push(CMD_USE);
            pcVar8 = cmdq_peek();
            cmd_set_arg_target(pcVar8,"target",L'\x05');
          }
        }
        else {
          cmdq_push(CMD_CAST);
          pcVar8 = cmdq_peek();
          cmd_set_arg_target(pcVar8,"target",L'\x05');
        }
      }
    }
  }
  return;
}

Assistant:

void textui_process_click(ui_event e)
{
	int x, y;

	if (!OPT(player, mouse_movement)) return;

	y = KEY_GRID_Y(e);
	x = KEY_GRID_X(e);

	/* Check for a valid location */
	if (!square_in_bounds_fully(cave, loc(x, y))) return;

	/* XXX show context menu here */
	if (loc_eq(player->grid, loc(x, y))) {
		if (e.mouse.mods & KC_MOD_SHIFT) {
			/* shift-click - cast magic */
			if (e.mouse.button == 1) {
				cmdq_push(CMD_CAST);
			} else if (e.mouse.button == 2) {
				Term_keypress('i',0);
			}
		} else if (e.mouse.mods & KC_MOD_CONTROL) {
			/* ctrl-click - use feature / use inventory item */
			/* switch with default */
			if (e.mouse.button == 1) {
				if (square_isupstairs(cave, player->grid))
					cmdq_push(CMD_GO_UP);
				else if (square_isdownstairs(cave, player->grid))
					cmdq_push(CMD_GO_DOWN);
			} else if (e.mouse.button == 2) {
				cmdq_push(CMD_USE);
			}
		} else if (e.mouse.mods & KC_MOD_ALT) {
			/* alt-click - show char screen */
			/* XXX call a platform specific hook */
			if (e.mouse.button == 1) {
				Term_keypress('C',0);
			}
		} else {
			if (e.mouse.button == 1) {
				if (square_object(cave, loc(x, y))) {
					cmdq_push(CMD_PICKUP);
				} else {
					cmdq_push(CMD_HOLD);
				}
			} else if (e.mouse.button == 2) {
				/* Show a context menu */
				context_menu_player(e.mouse.x, e.mouse.y);
			}
		}
	} else if (e.mouse.button == 1) {
		if (player->timed[TMD_CONFUSED]) {
			cmdq_push(CMD_WALK);
		} else {
			if (e.mouse.mods & KC_MOD_SHIFT) {
				/* shift-click - run */
				cmdq_push(CMD_RUN);
				cmd_set_arg_direction(cmdq_peek(), "direction",
									  motion_dir(player->grid, loc(x, y)));
			} else if (e.mouse.mods & KC_MOD_CONTROL) {
				/* control-click - alter */
				cmdq_push(CMD_ALTER);
				cmd_set_arg_direction(cmdq_peek(), "direction",
									  motion_dir(player->grid, loc(x, y)));
			} else if (e.mouse.mods & KC_MOD_ALT) {
				/* alt-click - look */
				if (target_set_interactive(TARGET_LOOK, x, y)) {
					msg("Target Selected.");
				}
			} else {
				/* Pathfind does not work well on trap detection borders,
				 * so if the click is next to the player, force a walk step */
				if ((y - player->grid.y >= -1) && (y - player->grid.y <= 1)	&&
					(x - player->grid.x >= -1) && (x - player->grid.x <= 1)) {
					cmdq_push(CMD_WALK);
					cmd_set_arg_direction(cmdq_peek(), "direction",
										  motion_dir(player->grid, loc(x, y)));
				} else {
					cmdq_push(CMD_PATHFIND);
					cmd_set_arg_point(cmdq_peek(), "point", loc(x, y));
				}
			}
		}
	} else if (e.mouse.button == 2) {
		struct monster *m = square_monster(cave, loc(x, y));
		if (m && target_able(m)) {
			/* Set up target information */
			monster_race_track(player->upkeep, m->race);
			health_track(player->upkeep, m);
			target_set_monster(m);
		} else {
			target_set_location(y, x);
		}

		if (e.mouse.mods & KC_MOD_SHIFT) {
			/* shift-click - cast spell at target */
			cmdq_push(CMD_CAST);
			cmd_set_arg_target(cmdq_peek(), "target", DIR_TARGET);
		} else if (e.mouse.mods & KC_MOD_CONTROL) {
			/* control-click - fire at target */
			cmdq_push(CMD_USE);
			cmd_set_arg_target(cmdq_peek(), "target", DIR_TARGET);
		} else if (e.mouse.mods & KC_MOD_ALT) {
			/* alt-click - throw at target */
			cmdq_push(CMD_THROW);
			cmd_set_arg_target(cmdq_peek(), "target", DIR_TARGET);
		} else {
			/* see if the click was adjacent to the player */
			if ((y - player->grid.y >= -1) && (y - player->grid.y <= 1)	&&
				(x - player->grid.x >= -1) && (x - player->grid.x <= 1)) {
				context_menu_cave(cave,y,x,1,e.mouse.x, e.mouse.y);
			} else {
				context_menu_cave(cave,y,x,0,e.mouse.x, e.mouse.y);
			}
		}
	}
}